

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_messageboxbutton.cpp
# Opt level: O3

void QtMWidgets::MsgBoxButton::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  if (_c == InvokeMetaMethod) {
    if (_id == 1) {
      *(undefined1 *)(*(long *)(_o + 0x28) + 0x20) = 0;
      QWidget::update();
      return;
    }
    if (_id == 0) {
      *(undefined1 *)(*(long *)(_o + 0x28) + 0x20) = 1;
      QWidget::update();
      return;
    }
  }
  return;
}

Assistant:

void QtMWidgets::MsgBoxButton::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<MsgBoxButton *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->_q_pressed(); break;
        case 1: _t->_q_released(); break;
        default: ;
        }
    }
    (void)_a;
}